

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

string * __thiscall
slang::ast::GenerateBlockArraySymbol::getExternalName_abi_cxx11_
          (string *__return_storage_ptr__,GenerateBlockArraySymbol *this)

{
  bool bVar1;
  Scope *pSVar2;
  Scope *in_RCX;
  Scope *parent;
  allocator<char> local_19;
  GenerateBlockArraySymbol *local_18;
  GenerateBlockArraySymbol *this_local;
  
  local_18 = this;
  this_local = (GenerateBlockArraySymbol *)__return_storage_ptr__;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&(this->super_Symbol).name);
  if (bVar1) {
    pSVar2 = Symbol::getParentScope(&this->super_Symbol);
    if (pSVar2 == (Scope *)0x0) {
      assert::assertFailed
                ("parent",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/BlockSymbols.cpp"
                 ,0x2e2,"std::string slang::ast::GenerateBlockArraySymbol::getExternalName() const")
      ;
    }
    createGenBlkName_abi_cxx11_
              (__return_storage_ptr__,(ast *)(ulong)this->constructIndex,(uint32_t)pSVar2,in_RCX);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&(this->super_Symbol).name,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateBlockArraySymbol::getExternalName() const {
    if (!name.empty())
        return std::string(name);

    auto parent = getParentScope();
    ASSERT(parent);

    return createGenBlkName(constructIndex, *parent);
}